

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O3

bool __thiscall VideoHppGenerator::isExtension(VideoHppGenerator *this,string *name)

{
  pointer pEVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  pointer pEVar3;
  
  pEVar3 = (this->m_extensions).
           super__Vector_base<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->m_extensions).
           super__Vector_base<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    do {
      if ((pEVar3->name)._M_string_length == __n) {
        if (__n == 0) {
          return true;
        }
        iVar2 = bcmp((pEVar3->name)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) {
          return true;
        }
      }
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar1);
  }
  return false;
}

Assistant:

bool VideoHppGenerator::isExtension( std::string const & name ) const
{
  return std::ranges::any_of( m_extensions, [&name]( ExtensionData const & ed ) { return ed.name == name; } );
}